

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::enum_<ImPlotMarker_>::enum_<char[23]>
          (enum_<ImPlotMarker_> *this,handle *scope,char *name,char (*extra) [23])

{
  str_attr_accessor local_c0;
  arg local_a0;
  is_method local_90;
  name local_88;
  is_new_style_constructor local_7a;
  type local_79;
  cpp_function local_78;
  type local_6a;
  type local_69;
  arg local_68;
  anon_class_1_0_00000001 local_50;
  factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JoelLinn[P]py_mahi_gui_thirdparty_pybind11_include_pybind11_pybind11_h:1733:18),_pybind11::detail::void_type_(*)(),_ImPlotMarker__(int),_pybind11::detail::void_type_()>
  local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  bool is_convertible;
  bool is_arithmetic;
  PyObject *local_40;
  PyObject *local_38;
  PyObject *local_30;
  char (*local_28) [23];
  char (*extra_local) [23];
  char *name_local;
  handle *scope_local;
  enum_<ImPlotMarker_> *this_local;
  
  local_30 = scope->m_ptr;
  local_28 = extra;
  extra_local = (char (*) [23])name;
  name_local = (char *)scope;
  scope_local = (handle *)this;
  class_<ImPlotMarker_>::class_<char[23]>
            (&this->super_class_<ImPlotMarker_>,(handle)local_30,name,extra);
  local_38 = (this->super_class_<ImPlotMarker_>).super_generic_type.super_object.super_handle.m_ptr;
  local_40 = *(PyObject **)name_local;
  pybind11::detail::enum_base::enum_base(&this->m_base,(handle)local_38,(handle)local_40);
  local_4d = 0;
  local_4e = 1;
  pybind11::detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  init<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(int)_1_,pybind11::detail::initimpl::factory<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(int)_1_,pybind11::detail::void_type(*)(),ImPlotMarker_(int),pybind11::detail::void_type()>>
            (&local_50);
  pybind11::arg::arg(&local_68,"value");
  class_<ImPlotMarker_>::
  def<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(int)_1_,pybind11::detail::void_type(*)(),ImPlotMarker_(int),pybind11::detail::void_type(),pybind11::arg>
            (&this->super_class_<ImPlotMarker_>,&local_4f,&local_68);
  class_<ImPlotMarker_>::
  def<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(ImPlotMarker_)_1_>
            (&this->super_class_<ImPlotMarker_>,"__int__",&local_69);
  class_<ImPlotMarker_>::
  def<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(ImPlotMarker_)_2_>
            (&this->super_class_<ImPlotMarker_>,"__index__",&local_6a);
  pybind11::name::name(&local_88,"__setstate__");
  is_method::is_method(&local_90,(handle *)this);
  pybind11::arg::arg(&local_a0,"state");
  cpp_function::
  cpp_function<pybind11::enum_<ImPlotMarker_>::enum_<char[23]>(pybind11::handle_const&,char_const*,char_const(&)[23])::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            (&local_78,&local_79,&local_7a,&local_88,&local_90,&local_a0);
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_c0,(object_api<pybind11::handle> *)this,"__setstate__");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_c0,&local_78);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_c0);
  cpp_function::~cpp_function(&local_78);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Scalar>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(v_h, static_cast<Type>(arg),
                        Py_TYPE(v_h.inst) != v_h.type->type); },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"), is_method(*this), arg("state"));
    }